

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstreams.cpp
# Opt level: O0

ssize_t __thiscall HPack::BitIStream::read(BitIStream *this,int __fd,void *__buf,size_t __nbytes)

{
  bool bVar1;
  quint64 qVar2;
  ulong uVar3;
  char *__nbytes_00;
  void *__buf_00;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  char *src;
  quint64 oldOffset;
  QByteArray *dst;
  quint32 len;
  uchar compressed;
  BitIStream slice;
  QByteArray *in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  BitIStream *in_stack_ffffffffffffff78;
  uchar *dstPtr;
  undefined1 local_49;
  Data *in_stack_ffffffffffffffb8;
  uint local_30;
  char local_29;
  BitIStream local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  dstPtr = (uchar *)this->offset;
  local_29 = '\0';
  __nbytes_00 = &local_29;
  qVar2 = peekBits<unsigned_char>
                    ((BitIStream *)CONCAT44(in_register_00000034,__fd),
                     (quint64)CONCAT44(in_register_00000034,__fd),(quint64)in_stack_ffffffffffffffb8
                     ,dstPtr);
  if ((qVar2 != 1) ||
     (bVar1 = skipBits(in_stack_ffffffffffffff78,
                       CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70)), !bVar1)) {
    setError(this,NotEnoughData);
    local_49 = 0;
    goto LAB_0028de33;
  }
  setError(this,NoError);
  local_30 = 0;
  uVar3 = read(this,(int)&local_30,__buf_00,(size_t)__nbytes_00);
  if ((uVar3 & 1) != 0) {
    uVar3 = (ulong)local_30;
    qVar2 = bitLength(this);
    if (qVar2 - this->offset >> 3 < uVar3) {
      setError(this,NotEnoughData);
    }
    else {
      if (local_29 == '\0') {
        QByteArray::QByteArray
                  ((QByteArray *)&stack0xffffffffffffffb8,
                   (char *)(this->first + (this->offset >> 3)),(ulong)local_30);
        QByteArray::operator=
                  ((QByteArray *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
                   in_stack_ffffffffffffff68);
        QByteArray::~QByteArray((QByteArray *)0x28dd46);
        this->offset = (ulong)local_30 * 8 + this->offset;
        local_49 = 1;
        goto LAB_0028de33;
      }
      local_28.first = (uchar *)0xaaaaaaaaaaaaaaaa;
      local_28.last = (uchar *)0xaaaaaaaaaaaaaaaa;
      local_28.offset = 0xaaaaaaaaaaaaaaaa;
      local_28.streamError = 0xaaaaaaaa;
      local_28._28_4_ = 0xaaaaaaaa;
      BitIStream(&local_28,this->first + (this->offset >> 3),
                 this->first + (ulong)local_30 + (this->offset >> 3));
      bVar1 = huffman_decode_string
                        ((BitIStream *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70)
                         ,in_stack_ffffffffffffff68);
      if (bVar1) {
        this->offset = (ulong)local_30 * 8 + this->offset;
        local_49 = 1;
        goto LAB_0028de33;
      }
      setError(this,CompressionError);
    }
  }
  this->offset = (quint64)dstPtr;
  local_49 = 0;
LAB_0028de33:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return CONCAT71((int7)((ulong)*(long *)(in_FS_OFFSET + 0x28) >> 8),local_49);
}

Assistant:

bool BitIStream::read(QByteArray *dstPtr)
{
    Q_ASSERT(dstPtr);
    QByteArray &dst = *dstPtr;
    //5.2 String Literal Representation
    //
    // Header field names and header field values can be represented as string literals.
    // A string literal is compressed as a sequence of octets, either by directly encoding
    // the string literal's octets or by using a Huffman code.

    // We update the offset _only_ if the read was successful.

    const quint64 oldOffset = offset;
    uchar compressed = 0;
    if (peekBits(offset, 1, &compressed) != 1 || !skipBits(1)) {
        setError(Error::NotEnoughData);
        return false;
    }

    setError(Error::NoError);

    quint32 len = 0;
    if (read(&len)) {
        Q_ASSERT(!(offset % 8));
        if (len <= (bitLength() - offset) / 8) { // We have enough data to read a string ...
            if (!compressed) {
                // Now good news, integer always ends on a byte boundary.
                // We can read 'len' bytes without any bit magic.
                const char *src = reinterpret_cast<const char *>(first + offset / 8);
                dst = QByteArray(src, len);
                offset += quint64(len) * 8;
                return true;
            }

            BitIStream slice(first + offset / 8, first + offset / 8 + len);
            if (huffman_decode_string(slice, &dst)) {
                offset += quint64(len) * 8;
                return true;
            }

            setError(Error::CompressionError);
        } else {
            setError(Error::NotEnoughData);
        }
    } // else the exact reason was set by read(quint32).

    offset = oldOffset;
    return false;
}